

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

exr_result_t dispatch_write(exr_context_t ctxt,void *buf,uint64_t sz,uint64_t *offsetp)

{
  long lVar1;
  long *in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int64_t rval;
  exr_result_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else if (in_RCX == (long *)0x0) {
    local_4 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"write requested with no output offset pointer")
    ;
  }
  else if (*(long *)(in_RDI + 0xa8) == 0) {
    local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,8);
  }
  else {
    lVar1 = (**(code **)(in_RDI + 0xa8))
                      (in_RDI,*(undefined8 *)(in_RDI + 0x88),in_RSI,in_RDX,*in_RCX,
                       *(undefined8 *)(in_RDI + 0x48));
    if (0 < lVar1) {
      *in_RCX = lVar1 + *in_RCX;
    }
    local_4 = 0xb;
    if (lVar1 == in_RDX) {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static exr_result_t
dispatch_write (
    exr_context_t ctxt, const void* buf, uint64_t sz, uint64_t* offsetp)
{
    int64_t rval = -1;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!offsetp)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "write requested with no output offset pointer");

    if (ctxt->write_fn)
        rval = ctxt->write_fn (
            ctxt, ctxt->user_data, buf, sz, *offsetp, ctxt->print_error);
    else
        return ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE);

    if (rval > 0) *offsetp += (uint64_t) rval;

    return (rval == (int64_t) sz) ? EXR_ERR_SUCCESS : EXR_ERR_WRITE_IO;
}